

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CodeSubselect(Parse *pParse,Expr *pExpr)

{
  long lVar1;
  Expr *pEVar2;
  int iVar3;
  char *pcVar4;
  char *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  Vdbe *v;
  Expr *pLimit;
  int nReg;
  Select *pSel;
  int rReg;
  int addrOnce;
  SelectDest dest;
  SelectDest *in_stack_00000200;
  Select *in_stack_00000208;
  Parse *in_stack_00000210;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  sqlite3 *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int op;
  sqlite3 *in_stack_ffffffffffffff88;
  Expr *local_68;
  int local_4c;
  int local_34;
  SelectDest local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_4c = 0;
  memset(&local_30,0xaa,0x28);
  if (*(int *)((long)&in_RDI->flags + 4) == 0) {
    lVar1 = *(long *)(in_RSI + 0x20);
    if ((*(uint *)(in_RSI + 4) & 0x2000000) == 0) {
      *(uint *)(in_RSI + 4) = *(uint *)(in_RSI + 4) | 0x2000000;
      iVar3 = *(int *)((long)&in_RDI->lastRowid + 4) + 1;
      *(int *)((long)&in_RDI->lastRowid + 4) = iVar3;
      *(int *)(in_RSI + 0x44) = iVar3;
      iVar3 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),in_stack_ffffffffffffff6c,
                                in_stack_ffffffffffffff68,0);
      *(int *)(in_RSI + 0x40) = iVar3 + 1;
      if ((*(uint *)(in_RSI + 4) & 0x40) == 0) {
        local_4c = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70),
                                     in_stack_ffffffffffffff6c);
      }
      pcVar4 = "CORRELATED ";
      if (local_4c != 0) {
        pcVar4 = "";
      }
      sqlite3VdbeExplain((Parse *)in_RDI,'\x01',"%sSCALAR SUBQUERY %d",pcVar4,
                         (ulong)*(uint *)(lVar1 + 0x10));
      if (*in_RSI == -0x75) {
        iVar3 = **(int **)(lVar1 + 0x20);
      }
      else {
        iVar3 = 1;
      }
      op = iVar3;
      sqlite3SelectDestInit(&local_30,0,*(int *)((long)&in_RDI->lastRowid + 4) + 1);
      *(int *)((long)&in_RDI->lastRowid + 4) = iVar3 + *(int *)((long)&in_RDI->lastRowid + 4);
      if (*in_RSI == -0x75) {
        local_30.eDest = '\n';
        local_30.iSdst = local_30.iSDParm;
        local_30.nSdst = iVar3;
        sqlite3VdbeAddOp3((Vdbe *)in_stack_ffffffffffffff88,op,in_stack_ffffffffffffff80,
                          (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (int)in_stack_ffffffffffffff78);
      }
      else {
        local_30.eDest = '\x03';
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      }
      if (*(long *)(lVar1 + 0x60) == 0) {
        sqlite3Expr(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                    (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        pEVar2 = sqlite3PExpr((Parse *)CONCAT44(op,in_stack_ffffffffffffff80),
                              (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                              (Expr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (Expr *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
        ;
        *(Expr **)(lVar1 + 0x60) = pEVar2;
      }
      else {
        in_stack_ffffffffffffff88 = (sqlite3 *)in_RDI->pVfs;
        local_68 = sqlite3Expr(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                              );
        if (local_68 != (Expr *)0x0) {
          local_68->affExpr = 'C';
          in_stack_ffffffffffffff78 = in_RDI;
          sqlite3ExprDup((sqlite3 *)CONCAT44(op,in_stack_ffffffffffffff80),(Expr *)in_RDI,
                         in_stack_ffffffffffffff74);
          local_68 = sqlite3PExpr((Parse *)CONCAT44(op,in_stack_ffffffffffffff80),
                                  (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                  (Expr *)CONCAT44(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70),
                                  (Expr *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68));
        }
        sqlite3ExprDeferredDelete
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (Expr *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        *(Expr **)(*(long *)(lVar1 + 0x60) + 0x10) = local_68;
      }
      *(undefined4 *)(lVar1 + 8) = 0;
      iVar3 = sqlite3Select(in_stack_00000210,in_stack_00000208,in_stack_00000200);
      if (iVar3 == 0) {
        *(int *)(in_RSI + 0x2c) = local_30.iSDParm;
        if (local_4c != 0) {
          sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
        }
        sqlite3VdbeAddOp3((Vdbe *)in_stack_ffffffffffffff88,op,in_stack_ffffffffffffff80,
                          (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (int)in_stack_ffffffffffffff78);
        sqlite3ClearTempRegCache((Parse *)in_RDI);
        local_34 = local_30.iSDParm;
      }
      else {
        in_RSI[2] = *in_RSI;
        *in_RSI = -0x4a;
        local_34 = 0;
      }
    }
    else {
      sqlite3VdbeExplain((Parse *)in_RDI,'\0',"REUSE SUBQUERY %d",(ulong)*(uint *)(lVar1 + 0x10));
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      local_34 = *(int *)(in_RSI + 0x2c);
    }
  }
  else {
    local_34 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3CodeSubselect(Parse *pParse, Expr *pExpr){
  int addrOnce = 0;           /* Address of OP_Once at top of subroutine */
  int rReg = 0;               /* Register storing resulting */
  Select *pSel;               /* SELECT statement to encode */
  SelectDest dest;            /* How to deal with SELECT result */
  int nReg;                   /* Registers to allocate */
  Expr *pLimit;               /* New limit expression */
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExplain;            /* Address of OP_Explain instruction */
#endif

  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  if( pParse->nErr ) return 0;
  testcase( pExpr->op==TK_EXISTS );
  testcase( pExpr->op==TK_SELECT );
  assert( pExpr->op==TK_EXISTS || pExpr->op==TK_SELECT );
  assert( ExprUseXSelect(pExpr) );
  pSel = pExpr->x.pSelect;

  /* If this routine has already been coded, then invoke it as a
  ** subroutine. */
  if( ExprHasProperty(pExpr, EP_Subrtn) ){
    ExplainQueryPlan((pParse, 0, "REUSE SUBQUERY %d", pSel->selId));
    assert( ExprUseYSub(pExpr) );
    sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr);
    return pExpr->iTable;
  }

  /* Begin coding the subroutine */
  assert( !ExprUseYWin(pExpr) );
  assert( !ExprHasProperty(pExpr, EP_Reduced|EP_TokenOnly) );
  ExprSetProperty(pExpr, EP_Subrtn);
  pExpr->y.sub.regReturn = ++pParse->nMem;
  pExpr->y.sub.iAddr =
    sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;

  /* The evaluation of the EXISTS/SELECT must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can run this code just once
  ** save the results, and reuse the same result on subsequent invocations.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) ){
    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* For a SELECT, generate code to put the values for all columns of
  ** the first row into an array of registers and return the index of
  ** the first register.
  **
  ** If this is an EXISTS, write an integer 0 (not exists) or 1 (exists)
  ** into a register and return that register number.
  **
  ** In both cases, the query is augmented with "LIMIT 1".  Any
  ** preexisting limit is discarded in place of the new LIMIT 1.
  */
  ExplainQueryPlan2(addrExplain, (pParse, 1, "%sSCALAR SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSel->selId));
  sqlite3VdbeScanStatusCounters(v, addrExplain, addrExplain, -1);
  nReg = pExpr->op==TK_SELECT ? pSel->pEList->nExpr : 1;
  sqlite3SelectDestInit(&dest, 0, pParse->nMem+1);
  pParse->nMem += nReg;
  if( pExpr->op==TK_SELECT ){
    dest.eDest = SRT_Mem;
    dest.iSdst = dest.iSDParm;
    dest.nSdst = nReg;
    sqlite3VdbeAddOp3(v, OP_Null, 0, dest.iSDParm, dest.iSDParm+nReg-1);
    VdbeComment((v, "Init subquery result"));
  }else{
    dest.eDest = SRT_Exists;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, dest.iSDParm);
    VdbeComment((v, "Init EXISTS result"));
  }
  if( pSel->pLimit ){
    /* The subquery already has a limit.  If the pre-existing limit is X
    ** then make the new limit X<>0 so that the new limit is either 1 or 0 */
    sqlite3 *db = pParse->db;
    pLimit = sqlite3Expr(db, TK_INTEGER, "0");
    if( pLimit ){
      pLimit->affExpr = SQLITE_AFF_NUMERIC;
      pLimit = sqlite3PExpr(pParse, TK_NE,
                            sqlite3ExprDup(db, pSel->pLimit->pLeft, 0), pLimit);
    }
    sqlite3ExprDeferredDelete(pParse, pSel->pLimit->pLeft);
    pSel->pLimit->pLeft = pLimit;
  }else{
    /* If there is no pre-existing limit add a limit of 1 */
    pLimit = sqlite3Expr(pParse->db, TK_INTEGER, "1");
    pSel->pLimit = sqlite3PExpr(pParse, TK_LIMIT, pLimit, 0);
  }
  pSel->iLimit = 0;
  if( sqlite3Select(pParse, pSel, &dest) ){
    pExpr->op2 = pExpr->op;
    pExpr->op = TK_ERROR;
    return 0;
  }
  pExpr->iTable = rReg = dest.iSDParm;
  ExprSetVVAProperty(pExpr, EP_NoReduce);
  if( addrOnce ){
    sqlite3VdbeJumpHere(v, addrOnce);
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, addrExplain, -1);

  /* Subroutine return */
  assert( ExprUseYSub(pExpr) );
  assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
          || pParse->nErr );
  sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                    pExpr->y.sub.iAddr, 1);
  VdbeCoverage(v);
  sqlite3ClearTempRegCache(pParse);
  return rReg;
}